

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O0

void finish(nn *n)

{
  example *in_RDI;
  _func_void_void_ptr *unaff_retaddr;
  _func_void_void_ptr *delete_prediction;
  
  delete_prediction = (_func_void_void_ptr *)(in_RDI->super_example_predict).indices._end;
  if (delete_prediction != (_func_void_void_ptr *)0x0) {
    (**(code **)(*(long *)delete_prediction + 0x48))();
  }
  free(in_RDI[3].super_example_predict.feature_space[0].indicies._begin);
  free(in_RDI[3].super_example_predict.feature_space[0].indicies._end);
  free(in_RDI[3].super_example_predict.feature_space[0].indicies.end_array);
  free((void *)in_RDI[3].super_example_predict.feature_space[0].indicies.erase_count);
  VW::dealloc_example(unaff_retaddr,in_RDI,delete_prediction);
  VW::dealloc_example(unaff_retaddr,in_RDI,delete_prediction);
  VW::dealloc_example(unaff_retaddr,in_RDI,delete_prediction);
  return;
}

Assistant:

void finish(nn& n)
{
  delete n.squared_loss;
  free(n.hidden_units);
  free(n.dropped_out);
  free(n.hidden_units_pred);
  free(n.hiddenbias_pred);
  VW::dealloc_example(nullptr, n.output_layer);
  VW::dealloc_example(nullptr, n.hiddenbias);
  VW::dealloc_example(nullptr, n.outputweight);
}